

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall
CEditor::InvokeFileDialog
          (CEditor *this,int StorageType,int FileType,char *pTitle,char *pButtonText,char *pBasePath
          ,char *pDefaultName,_func_void_char_ptr_int_void_ptr *pfnFunc,void *pUser)

{
  CUI *this_00;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  CEditor *in_RDI;
  char *in_R8;
  long in_R9;
  long in_stack_00000008;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  in_RDI->m_FileDialogStorageType = in_ESI;
  in_RDI->m_pFileDialogTitle = in_RCX;
  in_RDI->m_pFileDialogButtonText = in_R8;
  in_RDI->m_pfnFileDialogFunc = (_func_void_char_ptr_int_void_ptr *)pBasePath;
  in_RDI->m_pFileDialogUser = pButtonText;
  in_RDI->m_aFileDialogFileName[0] = '\0';
  in_RDI->m_aFileDialogCurrentFolder[0] = '\0';
  in_RDI->m_aFileDialogCurrentLink[0] = '\0';
  in_RDI->m_aFileDialogFilterString[0] = '\0';
  in_RDI->m_pFileDialogPath = in_RDI->m_aFileDialogCurrentFolder;
  in_RDI->m_FileDialogFileType = in_EDX;
  in_RDI->m_FileDialogScrollValue = 0.0;
  this_00 = UI(in_RDI);
  CUI::SetActiveItem(this_00,&in_RDI->m_FileDialogFilterInput);
  in_RDI->m_PreviewImageIsLoaded = false;
  if (in_stack_00000008 != 0) {
    str_copy((char *)in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0)
    ;
  }
  if (in_R9 != 0) {
    str_copy((char *)in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0)
    ;
  }
  FilelistPopulate(in_RDI,in_stack_ffffffffffffffcc);
  in_RDI->m_Dialog = 1;
  return;
}

Assistant:

void CEditor::InvokeFileDialog(int StorageType, int FileType, const char *pTitle, const char *pButtonText,
	const char *pBasePath, const char *pDefaultName,
	void (*pfnFunc)(const char *pFileName, int StorageType, void *pUser), void *pUser)
{
	m_FileDialogStorageType = StorageType;
	m_pFileDialogTitle = pTitle;
	m_pFileDialogButtonText = pButtonText;
	m_pfnFileDialogFunc = pfnFunc;
	m_pFileDialogUser = pUser;
	m_aFileDialogFileName[0] = 0;
	m_aFileDialogCurrentFolder[0] = 0;
	m_aFileDialogCurrentLink[0] = 0;
	m_aFileDialogFilterString[0] = 0;
	m_pFileDialogPath = m_aFileDialogCurrentFolder;
	m_FileDialogFileType = FileType;
	m_FileDialogScrollValue = 0.0f;
	UI()->SetActiveItem(&m_FileDialogFilterInput);
	m_PreviewImageIsLoaded = false;

	if(pDefaultName)
		str_copy(m_aFileDialogFileName, pDefaultName, sizeof(m_aFileDialogFileName));
	if(pBasePath)
		str_copy(m_aFileDialogCurrentFolder, pBasePath, sizeof(m_aFileDialogCurrentFolder));

	FilelistPopulate(m_FileDialogStorageType);

	m_Dialog = DIALOG_FILE;
}